

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::NoopNormalizer2::normalizeSecondAndAppend
          (NoopNormalizer2 *this,UnicodeString *first,UnicodeString *second,UErrorCode *errorCode)

{
  short sVar1;
  int32_t srcLength;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (first == second) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      sVar1 = (second->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        srcLength = (second->fUnion).fFields.fLength;
      }
      else {
        srcLength = (int)sVar1 >> 5;
      }
      UnicodeString::doAppend(first,second,0,srcLength);
    }
  }
  return first;
}

Assistant:

virtual UnicodeString &
    normalizeSecondAndAppend(UnicodeString &first,
                             const UnicodeString &second,
                             UErrorCode &errorCode) const U_OVERRIDE {
        if(U_SUCCESS(errorCode)) {
            if(&first!=&second) {
                first.append(second);
            } else {
                errorCode=U_ILLEGAL_ARGUMENT_ERROR;
            }
        }
        return first;
    }